

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldblib.c
# Opt level: O0

int db_upvaluejoin(lua_State *L)

{
  int iVar1;
  int local_18;
  int local_14;
  int n2;
  int n1;
  lua_State *L_local;
  
  _n2 = L;
  checkupval(L,1,2,&local_14);
  checkupval(_n2,3,4,&local_18);
  iVar1 = lua_iscfunction(_n2,1);
  if (iVar1 != 0) {
    luaL_argerror(_n2,1,"Lua function expected");
  }
  iVar1 = lua_iscfunction(_n2,3);
  if (iVar1 != 0) {
    luaL_argerror(_n2,3,"Lua function expected");
  }
  lua_upvaluejoin(_n2,1,local_14,3,local_18);
  return 0;
}

Assistant:

static int db_upvaluejoin (lua_State *L) {
  int n1, n2;
  checkupval(L, 1, 2, &n1);
  checkupval(L, 3, 4, &n2);
  luaL_argcheck(L, !lua_iscfunction(L, 1), 1, "Lua function expected");
  luaL_argcheck(L, !lua_iscfunction(L, 3), 3, "Lua function expected");
  lua_upvaluejoin(L, 1, n1, 3, n2);
  return 0;
}